

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipUtilities.hpp
# Opt level: O1

string * __thiscall
Zippy::Impl::GenerateRandomName_abi_cxx11_(string *__return_storage_ptr__,Impl *this,int length)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  result_type rVar3;
  ulong uVar4;
  size_t __i;
  long lVar5;
  ulong uVar6;
  uniform_int_distribution<int> distr;
  string letters;
  string result;
  mt19937 generator;
  random_device rand_dev;
  param_type local_2788;
  long *local_2780;
  int local_2778;
  long local_2770 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2760;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  uVar6 = (ulong)this & 0xffffffff;
  local_2780 = local_2770;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2780,"abcdefghijklmnopqrstuvwxyz0123456789","");
  std::random_device::random_device(&local_13b8);
  uVar2 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar2;
  lVar5 = 1;
  uVar4 = local_2740._M_x[0];
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar5);
    local_2740._M_x[lVar5] = uVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  local_2740._M_p = 0x270;
  local_2788._M_b = local_2778 + -1;
  local_2788._M_a = 0;
  paVar1 = &local_2760.field_2;
  local_2760._M_string_length = 0;
  local_2760.field_2._M_local_buf[0] = '\0';
  local_2760._M_dataplus._M_p = (pointer)paVar1;
  if (0 < (int)this) {
    do {
      rVar3 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_2788,&local_2740,&local_2788);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_2760,*(char *)((long)local_2780 + (long)rVar3));
      uVar2 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar2;
    } while (uVar2 != 0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_2760._M_dataplus._M_p,
             local_2760._M_dataplus._M_p + local_2760._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,".tmp");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2760._M_dataplus._M_p != paVar1) {
    operator_delete(local_2760._M_dataplus._M_p,
                    CONCAT71(local_2760.field_2._M_allocated_capacity._1_7_,
                             local_2760.field_2._M_local_buf[0]) + 1);
  }
  std::random_device::_M_fini();
  if (local_2780 != local_2770) {
    operator_delete(local_2780,local_2770[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string GenerateRandomName(int length) {

        std::string letters = "abcdefghijklmnopqrstuvwxyz0123456789";

        std::random_device                 rand_dev;
        std::mt19937                       generator(rand_dev());
        std::uniform_int_distribution<int> distr(0, letters.size() - 1);

        std::string result;
        for (int    i       = 0; i < length; ++i) {
            result += letters[distr(generator)];
        }

        return result + ".tmp";
    }